

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrXML.cpp
# Opt level: O3

IrrXMLReader * irr::io::createIrrXMLReader(FILE *file)

{
  CXMLReaderImpl<char,_irr::io::IXMLBase> *this;
  CFileReadCallBack *this_00;
  
  this = (CXMLReaderImpl<char,_irr::io::IXMLBase> *)operator_new(0x88);
  this_00 = (CFileReadCallBack *)operator_new(0x18);
  (this_00->super_IFileReadCallBack)._vptr_IFileReadCallBack =
       (_func_int **)&PTR__CFileReadCallBack_008daa10;
  this_00->File = file;
  this_00->Size = 0;
  this_00->Close = false;
  if (file != (FILE *)0x0) {
    CFileReadCallBack::getFileSize(this_00);
  }
  CXMLReaderImpl<char,_irr::io::IXMLBase>::CXMLReaderImpl(this,(IFileReadCallBack *)this_00,true);
  return &this->super_IIrrXMLReader<char,_irr::io::IXMLBase>;
}

Assistant:

IrrXMLReader* createIrrXMLReader(FILE* file)
{
	return new CXMLReaderImpl<char, IXMLBase>(new CFileReadCallBack(file)); 
}